

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

int tcg_gen_code_arm(TCGContext_conflict *s,TranslationBlock *tb)

{
  anon_union_16_2_aaf24f3d_for_link *paVar1;
  TCGTemp **ppTVar2;
  tcg_insn_unit **pptVar3;
  char **ppcVar4;
  ushort uVar5;
  TCGOp *pTVar6;
  TCGArg TVar7;
  tcg_insn_unit *ptVar8;
  tcg_target_ulong tVar9;
  TCGArgConstraint *pTVar10;
  TCGOpDef *pTVar11;
  ulong uVar12;
  uintptr_t value;
  TCGRegSet *pTVar13;
  uint *puVar14;
  anon_union_16_2_aaf24f3d_for_link *paVar15;
  tcg_insn_unit tVar16;
  byte bVar17;
  _Bool _Var18;
  TCGOpcode TVar19;
  TCGReg TVar20;
  int iVar21;
  uint uVar22;
  char *pcVar23;
  ulong uVar24;
  TCGOp *pTVar25;
  TCGOp *pTVar26;
  TCGTemp *pTVar27;
  TCGCond *pTVar28;
  byte *pbVar29;
  uint8_t *puVar30;
  QTailQLink *pQVar31;
  QTailQLink *extraout_RAX;
  void **ppvVar32;
  undefined8 extraout_RAX_00;
  TCGLifeData arg_life;
  uint uVar33;
  TCGRegSet TVar34;
  uint uVar35;
  TCGCond TVar36;
  TCGCond base;
  long lVar37;
  TCGOp *pTVar38;
  TCGContext_conflict *pTVar39;
  undefined1 *puVar40;
  QTailQLink *pQVar41;
  QTailQLink *pQVar42;
  ulong uVar43;
  TCGCond r;
  TCGArg TVar44;
  byte bVar45;
  TCGRegSet TVar46;
  TCGRegSet allocated_regs;
  int iVar47;
  TCGContext_conflict *pTVar48;
  undefined2 uVar50;
  uint uVar51;
  TCGContext_conflict *pTVar52;
  TCGOpcode TVar53;
  TCGType_conflict TVar54;
  uint uVar55;
  TCGTemp *pTVar56;
  ulong uVar57;
  uint uVar58;
  TCGTemp *pTVar59;
  TCGContext_conflict *pTVar60;
  TCGRegSet preferred_regs;
  uint uVar61;
  TCGContext_conflict *in_R9;
  TCGContext_conflict *pTVar62;
  byte bVar63;
  uint uVar64;
  int iVar65;
  ulong unaff_R12;
  long lVar66;
  TCGLabelQemuLdst *pTVar67;
  ulong uVar68;
  ulong uVar69;
  long lVar70;
  TCGContext_conflict *pTVar71;
  tcg_insn_unit **pptVar72;
  TCGLabel *pTVar73;
  TCGRelocation *pTVar74;
  bool bVar75;
  TCGArg new_args [16];
  TCGContext_conflict *in_stack_fffffffffffffe58;
  uint local_15c;
  TCGContext_conflict *local_118;
  TCGContext_conflict *local_110;
  TCGContext_conflict *local_108;
  tcg_insn_unit local_100;
  undefined4 uStack_fc;
  int local_f8;
  undefined4 uStack_f4;
  TCGCond local_f0;
  undefined4 uStack_ec;
  void **local_90;
  void **local_88;
  target_ulong_conflict (*local_80) [3];
  int local_78;
  int local_74;
  uint local_70;
  int local_68;
  int local_64;
  TCGContext_conflict *pTVar49;
  
  pcVar23 = getenv("UNICORN_DEBUG");
  if (pcVar23 != (char *)0x0) {
    tcg_dump_ops_arm(s,false,"TCG before optimization:");
  }
  tcg_optimize_arm(s);
  if ((s->ops).tqh_first != (TCGOp *)0x0) {
    uVar24 = 0;
    pTVar38 = (s->ops).tqh_first;
    do {
      pTVar6 = (pTVar38->link).tqe_next;
      uVar64 = *(uint *)pTVar38;
      uVar33 = uVar64 & 0xff;
      uVar43 = uVar24;
      if (uVar33 < 0x81) {
        if (uVar33 == 1) {
          uVar64 = *(uint *)pTVar38->args[0];
          unaff_R12 = CONCAT71((int7)(unaff_R12 >> 8),1);
          if (0xffff < uVar64) {
            if ((((uVar64 & 0xffff0000) == 0x10000) &&
                (pTVar25 = (TCGOp *)((pTVar38->link).tqe_circ.tql_prev)->tql_prev->tql_next,
                *(char *)pTVar25 == '\x03')) &&
               ((uint *)pTVar38->args[0] == (uint *)pTVar25->args[0])) {
              tcg_op_remove_arm(s,pTVar25);
            }
            else {
              unaff_R12 = 0;
            }
            uVar43 = 0;
          }
        }
        else if (uVar33 == 2) {
          unaff_R12 = uVar24;
          if ((pTVar38->args[(ulong)((uVar64 >> 8 & 0xf) + (uVar64 >> 0xc & 0xf)) + 1] & 8) != 0) {
            uVar43 = 1;
          }
        }
        else {
          unaff_R12 = uVar24;
          if (uVar33 == 3) goto LAB_00566a3b;
        }
      }
      else if (uVar33 == 0x81) {
        unaff_R12 = 0;
      }
      else if ((uVar33 == 0x82) || (unaff_R12 = uVar24, uVar33 == 0x84)) {
LAB_00566a3b:
        uVar43 = 1;
        unaff_R12 = uVar24;
      }
      if ((unaff_R12 & 1) != 0) {
        tcg_op_remove_arm(s,pTVar38);
      }
      uVar24 = uVar43;
      pTVar38 = pTVar6;
    } while (pTVar6 != (TCGOp *)0x0);
  }
  liveness_pass_1(s);
  if (0 < s->nb_indirects) {
    iVar21 = s->nb_globals;
    if ((long)iVar21 < 1) {
      uVar24 = 0;
    }
    else {
      pTVar27 = s->temps;
      uVar24 = 0;
      pTVar56 = pTVar27;
      do {
        if ((pTVar56->field_0x4 & 2) == 0) {
          pTVar59 = (TCGTemp *)0x0;
        }
        else {
          iVar65 = s->nb_temps;
          s->nb_temps = iVar65 + 1;
          pTVar59 = pTVar27 + iVar65;
          ppcVar4 = &s->temps[iVar65].name;
          *ppcVar4 = (char *)0x0;
          ppcVar4[1] = (char *)0x0;
          ppTVar2 = &s->temps[iVar65].mem_base;
          *ppTVar2 = (TCGTemp *)0x0;
          ppTVar2[1] = (TCGTemp *)0x0;
          *(undefined8 *)(pTVar27 + iVar65) = 0;
          pTVar27[iVar65].val = 0;
          s->temps[iVar65].state_ptr = (void *)0x0;
          in_R9 = (TCGContext_conflict *)((ulong)(byte)pTVar56->field_0x3 << 0x18);
          *(TCGContext_conflict **)(pTVar27 + iVar65) = in_R9;
          *(ulong *)(pTVar27 + iVar65) =
               (ulong)((uint)(byte)pTVar56->field_0x2 << 0x10 | (uint)in_R9);
        }
        pTVar56->state_ptr = pTVar59;
        pTVar56->state = 1;
        uVar24 = uVar24 + 1;
        pTVar56 = pTVar56 + 1;
      } while ((long)iVar21 != uVar24);
    }
    if ((int)uVar24 < s->nb_temps) {
      lVar37 = (ulong)(uint)s->nb_temps - (uVar24 & 0xffffffff);
      ppvVar32 = &s->temps[uVar24 & 0xffffffff].state_ptr;
      do {
        *ppvVar32 = (void *)0x0;
        ppvVar32[-1] = (void *)0x1;
        ppvVar32 = ppvVar32 + 7;
        lVar37 = lVar37 + -1;
      } while (lVar37 != 0);
    }
    if ((s->ops).tqh_first != (TCGOp *)0x0) {
      bVar75 = false;
      pTVar38 = (s->ops).tqh_first;
      do {
        uVar64 = *(uint *)pTVar38;
        if ((uVar64 & 0xff) == 2) {
          pTVar60 = (TCGContext_conflict *)(ulong)(uVar64 >> 0xc & 0xf);
          uVar51 = uVar64 >> 8 & 0xf;
        }
        else {
          uVar33 = (uVar64 & 0xff) << 5;
          uVar51 = (uint)(&s->tcg_op_defs->nb_iargs)[uVar33];
          pTVar60 = (TCGContext_conflict *)(ulong)(&s->tcg_op_defs->nb_oargs)[uVar33];
        }
        pTVar6 = (pTVar38->link).tqe_next;
        uVar64 = uVar64 >> 0x10;
        unaff_R12 = (ulong)uVar64;
        if (uVar51 != 0) {
          pTVar52 = (TCGContext_conflict *)(ulong)(uVar51 + (int)pTVar60);
          pTVar48 = pTVar60;
          do {
            TVar44 = pTVar38->args[(long)pTVar48];
            if (((TVar44 != 0) && (TVar7 = *(TCGArg *)(TVar44 + 0x30), TVar7 != 0)) &&
               (*(long *)(TVar44 + 0x28) == 1)) {
              TVar53 = INDEX_op_ld_i32;
              if (*(char *)(TVar44 + 3) != '\0') {
                TVar53 = INDEX_op_ld_i64;
              }
              pTVar25 = tcg_op_alloc(s,TVar53);
              (pTVar25->link).tqe_circ.tql_prev = (pTVar38->link).tqe_circ.tql_prev;
              (pTVar25->link).tqe_next = pTVar38;
              ((pTVar38->link).tqe_circ.tql_prev)->tql_next = pTVar25;
              (pTVar38->link).tqe_circ.tql_prev = (QTailQLink *)&pTVar25->link;
              pTVar25->args[0] = TVar7;
              pTVar25->args[1] = *(TCGArg *)(TVar44 + 0x10);
              pTVar25->args[2] = *(TCGArg *)(TVar44 + 0x18);
              *(undefined8 *)(TVar44 + 0x28) = 2;
            }
            pTVar48 = (TCGContext_conflict *)((long)&pTVar48->pool_cur + 1);
            pTVar39 = pTVar60;
          } while (pTVar48 < pTVar52);
          do {
            TVar44 = pTVar38->args[(long)pTVar39];
            if ((TVar44 != 0) && (*(TCGArg *)(TVar44 + 0x30) != 0)) {
              pTVar38->args[(long)pTVar39] = *(TCGArg *)(TVar44 + 0x30);
              bVar75 = true;
              if ((uVar64 >> ((byte)pTVar39 & 0x1f) & 4) != 0) {
                *(undefined8 *)(TVar44 + 0x28) = 1;
              }
            }
            pTVar39 = (TCGContext_conflict *)((long)&pTVar39->pool_cur + 1);
          } while (pTVar39 < pTVar52);
        }
        in_R9 = pTVar60;
        if ((int)pTVar60 != 0) {
          paVar1 = &pTVar38->link;
          pTVar48 = (TCGContext_conflict *)0x0;
          do {
            TVar44 = pTVar38->args[(long)pTVar48];
            TVar7 = *(TCGArg *)(TVar44 + 0x30);
            if (TVar7 != 0) {
              pTVar38->args[(long)pTVar48] = TVar7;
              *(undefined8 *)(TVar44 + 0x28) = 0;
              if ((uVar64 >> ((uint)pTVar48 & 0x1f) & 1) != 0) {
                TVar53 = INDEX_op_st_i32;
                if (*(char *)(TVar44 + 3) != '\0') {
                  TVar53 = INDEX_op_st_i64;
                }
                pTVar26 = tcg_op_alloc(s,TVar53);
                pTVar25 = paVar1->tqe_next;
                (pTVar26->link).tqe_next = pTVar25;
                paVar15 = &pTVar25->link;
                if (pTVar25 == (TCGOp *)0x0) {
                  paVar15 = (anon_union_16_2_aaf24f3d_for_link *)&s->ops;
                }
                (paVar15->tqe_circ).tql_prev = (QTailQLink *)&pTVar26->link;
                paVar1->tqe_next = pTVar26;
                (pTVar26->link).tqe_circ.tql_prev = (QTailQLink *)paVar1;
                pTVar26->args[0] = TVar7;
                pTVar26->args[1] = *(TCGArg *)(TVar44 + 0x10);
                pTVar26->args[2] = *(TCGArg *)(TVar44 + 0x18);
                *(undefined8 *)(TVar44 + 0x28) = 2;
              }
              bVar75 = true;
              if ((uVar64 >> ((byte)pTVar48 & 0x1f) & 4) != 0) {
                *(undefined8 *)(TVar44 + 0x28) = 1;
              }
            }
            pTVar48 = (TCGContext_conflict *)((long)&pTVar48->pool_cur + 1);
          } while (pTVar60 != pTVar48);
        }
        pTVar38 = pTVar6;
      } while (pTVar6 != (TCGOp *)0x0);
      if (bVar75) {
        liveness_pass_1(s);
      }
    }
  }
  iVar21 = s->nb_globals;
  if ((long)iVar21 < 1) {
    uVar24 = 0;
  }
  else {
    pTVar27 = s->temps;
    uVar24 = 0;
    do {
      pTVar27->field_0x1 =
           (char)((uint)(((undefined1  [56])*pTVar27 & (undefined1  [56])0x100000000) ==
                        (undefined1  [56])0x0) * 0x100 + 0x100 >> 8);
      uVar24 = uVar24 + 1;
      pTVar27 = pTVar27 + 1;
    } while ((long)iVar21 != uVar24);
  }
  if ((int)uVar24 < s->nb_temps) {
    lVar37 = (ulong)(uint)s->nb_temps - (uVar24 & 0xffffffff);
    pTVar27 = s->temps + (uVar24 & 0xffffffff);
    do {
      *(ulong *)pTVar27 =
           *(ulong *)pTVar27 & 0xffffffeeffff00ff |
           (ulong)((uint)(*(ulong *)pTVar27 >> 0x1d) & 0x200);
      pTVar27 = pTVar27 + 1;
      lVar37 = lVar37 + -1;
    } while (lVar37 != 0);
  }
  ppTVar2 = s->reg_to_temp;
  memset(ppTVar2,0,0x100);
  ptVar8 = *(tcg_insn_unit **)&tb->cflags;
  s->code_buf = ptVar8;
  s->code_ptr = ptVar8;
  (s->ldst_labels).sqh_first = (TCGLabelQemuLdst *)0x0;
  (s->ldst_labels).sqh_last = &(s->ldst_labels).sqh_first;
  s->pool_labels = (TCGLabelPoolData *)0x0;
  pcVar23 = getenv("UNICORN_DEBUG");
  if (pcVar23 != (char *)0x0) {
    tcg_dump_ops_arm(s,false,"TCG before codegen:");
  }
  pptVar3 = &s->code_ptr;
  pTVar38 = (s->ops).tqh_first;
  if (pTVar38 == (TCGOp *)0x0) {
    local_15c = 0xffffffff;
  }
  else {
    local_88 = &s->tb_ret_addr;
    local_90 = &s->code_gen_epilogue;
    local_80 = s->gen_insn_data;
    local_15c = 0xffffffff;
    do {
      TVar53 = *(TCGOpcode *)pTVar38;
      TVar19 = TVar53 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64);
      arg_life = (TCGLifeData)(TVar53 >> 0x10);
      if (INDEX_op_ctpop_i32 < TVar19) {
        if (TVar19 < INDEX_op_mov_vec) {
          if (TVar19 != INDEX_op_mov_i64) {
            if (TVar19 != INDEX_op_insn_start) {
              if (TVar19 == INDEX_op_movi_i64) goto switchD_00566fc2_caseD_6;
              goto switchD_00566fc2_caseD_3;
            }
            if (((int)local_15c < 0) ||
               (uVar24 = (long)s->code_ptr - (long)s->code_buf,
               s->gen_insn_end_off[local_15c] = (uint16_t)uVar24, uVar24 < 0x10000)) {
              local_15c = local_15c + 1;
              lVar37 = 0;
              do {
                local_80[(int)local_15c][lVar37] = (target_ulong_conflict)pTVar38->args[lVar37];
                lVar37 = lVar37 + 1;
              } while (lVar37 != 3);
              goto LAB_005674d7;
            }
            goto LAB_0056910b;
          }
        }
        else if (TVar19 != INDEX_op_mov_vec) {
          if (TVar19 != INDEX_op_dup_vec) {
            if (TVar19 == INDEX_op_dupi_vec) goto switchD_00566fc2_caseD_6;
            goto switchD_00566fc2_caseD_3;
          }
          pTVar27 = (TCGTemp *)pTVar38->args[0];
          pTVar56 = (TCGTemp *)pTVar38->args[1];
          uVar64 = *(uint *)pTVar56;
          uVar33 = uVar64 >> 8 & 0xff;
          if (uVar33 == 3) {
            tVar9 = pTVar56->val;
            if ((TVar53 >> 0x13 & 1) != 0) {
              temp_free_or_dead(s,pTVar56,1);
            }
            tcg_reg_alloc_do_movi(s,pTVar27,tVar9,arg_life,pTVar38->output_pref[0]);
            unaff_R12 = unaff_R12 & 0xffffffff;
            goto LAB_005674d7;
          }
          pTVar10 = s->tcg_op_defs[0x8b].args_ct;
          uVar51 = pTVar10[1].u.regs;
          if (((uint)*(ulong *)pTVar27 & 0xff00) != 0x100) {
            uVar22 = 1 << ((byte)uVar64 & 0x1f);
            if (uVar33 != 1 || (TVar53 & 0x80000) != INDEX_op_discard) {
              uVar22 = 0;
            }
            TVar20 = tcg_reg_alloc(s,(pTVar10->u).regs,uVar22 | s->reserved_regs,
                                   pTVar38->output_pref[0],(*(ulong *)pTVar27 & 0x400000000) != 0);
            *(ulong *)pTVar27 =
                 (*(ulong *)pTVar27 & 0xfffffff7ffff0000) + (ulong)(TVar20 & 0xff) + 0x100;
            s->reg_to_temp[TVar20 & 0xff] = pTVar27;
          }
          uVar33 = TVar53 >> 0xc & 0xf;
          TVar54 = (TVar53 >> 8 & 0xf) + TCG_TYPE_V64;
          uVar24 = *(ulong *)pTVar56;
          if ((char)(uVar24 >> 8) == '\x02') {
LAB_00567cc4:
            in_R9 = (TCGContext_conflict *)pTVar56->mem_offset;
            tcg_out_dupm_vec(s,TVar54,uVar33,(uint)*(byte *)pTVar27,(uint)*(byte *)pTVar56->mem_base
                             ,(intptr_t)in_R9);
          }
          else {
            if (((uint)(uVar24 >> 8) & 0xff) != 1) {
              pcVar23 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
              ;
              iVar21 = 0xd22;
              goto LAB_00569136;
            }
            TVar20 = (TCGReg)uVar24 & 0xff;
            if ((uVar51 >> ((TCGReg)uVar24 & TCG_REG_XMM15) & 1) == 0) {
              if ((uVar24 >> 0x23 & 1) != 0) goto LAB_00567cc4;
              tcg_out_mov(s,uVar64 >> 0x18,(uint)*(byte *)pTVar27,TVar20);
              bVar17 = *(byte *)pTVar27;
              TVar20 = (TCGReg)bVar17;
            }
            else {
              bVar17 = *(byte *)pTVar27;
            }
            tcg_out_dup_vec(s,TVar54,uVar33,(uint)bVar17,TVar20);
          }
          if ((TVar53 >> 0x13 & 1) != 0) {
            temp_free_or_dead(s,pTVar56,1);
          }
          if ((TVar53 >> 0x10 & 1) != 0) {
            temp_sync(s,pTVar27,s->reserved_regs,0,0);
          }
          if ((TVar53 >> 0x12 & 1) != 0) {
            temp_free_or_dead(s,pTVar27,1);
          }
          goto LAB_005674d2;
        }
switchD_00566fc2_caseD_5:
        uVar64 = s->reserved_regs;
        TVar34 = pTVar38->output_pref[0];
        pTVar27 = (TCGTemp *)pTVar38->args[0];
        pTVar56 = (TCGTemp *)pTVar38->args[1];
        TVar54 = (TCGType_conflict)(byte)pTVar27->field_0x3;
        uVar24 = *(ulong *)pTVar56;
        if ((char)(uVar24 >> 8) == '\x02') {
          temp_load(s,pTVar56,s->tcg_target_available_regs[uVar24 >> 0x18 & 0xff],uVar64,TVar34);
        }
        else if (((uint)(uVar24 >> 8) & 0xff) == 3) {
          tVar9 = pTVar56->val;
          if ((TVar53 >> 0x13 & 1) != 0) {
            temp_free_or_dead(s,pTVar56,1);
          }
          tcg_reg_alloc_do_movi(s,pTVar27,tVar9,arg_life,TVar34);
          goto LAB_005674d2;
        }
        if ((TVar53 >> 0x12 & 1) == 0) {
          uVar24 = *(ulong *)pTVar27;
          uVar33 = (uint)uVar24 & 0xff00;
          if (((TVar53 >> 0x13 & 1) == 0) || ((*(ulong *)pTVar56 & 0x100000000) != 0)) {
            if (uVar33 != 0x100) {
              uVar64 = uVar64 | 1 << ((uint)*(ulong *)pTVar56 & 0x1f);
              TVar20 = tcg_reg_alloc(s,s->tcg_target_available_regs[TVar54],uVar64,TVar34,
                                     (uVar24 & 0x400000000) != 0);
              *(char *)pTVar27 = (char)TVar20;
            }
            tcg_out_mov(s,TVar54,(uint)*(byte *)pTVar27,(uint)*(byte *)pTVar56);
          }
          else {
            if (uVar33 == 0x100) {
              ppTVar2[uVar24 & 0xff] = (TCGTemp *)0x0;
            }
            *(undefined1 *)pTVar27 = *(undefined1 *)pTVar56;
            temp_free_or_dead(s,pTVar56,1);
          }
          uVar24 = *(ulong *)pTVar27;
          *(ulong *)pTVar27 = uVar24 & 0xfffffff7ffff00ff | 0x100;
          ppTVar2[uVar24 & 0xff] = pTVar27;
          if ((TVar53 >> 0x10 & 1) != 0) {
            temp_sync(s,pTVar27,uVar64,0,0);
          }
        }
        else {
          if ((pTVar27->field_0x4 & 0x10) == 0) {
            temp_allocate_frame(s,pTVar27);
          }
          tcg_out_st(s,TVar54,(uint)*(byte *)pTVar56,(uint)*(byte *)pTVar27->mem_base,
                     pTVar27->mem_offset);
          if ((TVar53 >> 0x13 & 1) != 0) {
            temp_free_or_dead(s,pTVar56,1);
          }
          temp_free_or_dead(s,pTVar27,1);
        }
LAB_005674d2:
        unaff_R12 = unaff_R12 & 0xffffffff;
        goto LAB_005674d7;
      }
      switch(TVar19) {
      case INDEX_op_discard:
        temp_free_or_dead(s,(TCGTemp *)pTVar38->args[0],1);
        goto LAB_005674d7;
      case INDEX_op_set_label:
        tcg_gen_code_arm_cold_19();
        goto LAB_005674d7;
      case INDEX_op_call:
        uVar33 = TVar53 >> 8 & 0xf;
        uVar64 = 6;
        if (uVar33 < 6) {
          uVar64 = TVar53 >> 8 & 0xf;
        }
        if (((long)(int)(uVar33 - uVar64) * 8 + 0xfU & 0xfffffffffffffff0) < 0x81) {
          uVar51 = TVar53 >> 0xc & 0xf;
          uVar24 = (ulong)uVar51;
          ptVar8 = (tcg_insn_unit *)pTVar38->args[uVar51 + uVar33];
          if (6 < uVar33) {
            lVar37 = 0;
            do {
              pTVar27 = *(TCGTemp **)((long)pTVar38->args + lVar37 + uVar24 * 8 + 0x30);
              if (pTVar27 != (TCGTemp *)0x0) {
                temp_load(s,pTVar27,s->tcg_target_available_regs[(byte)pTVar27->field_0x3],
                          s->reserved_regs,0);
                tcg_out_st(s,*(TCGReg *)pTVar27 >> 0x18,*(TCGReg *)pTVar27 & 0xff,TCG_REG_CALL_STACK
                           ,lVar37);
              }
              lVar37 = lVar37 + 8;
            } while ((ulong)uVar33 * 8 + -0x30 != lVar37);
          }
          uVar22 = s->reserved_regs;
          if (uVar33 != 0) {
            uVar43 = 0;
            do {
              pTVar27 = *(TCGTemp **)((long)pTVar38->args + uVar43 * 2 + uVar24 * 8);
              if (pTVar27 != (TCGTemp *)0x0) {
                TVar20 = *(TCGReg *)((long)tcg_target_call_iarg_regs + uVar43);
                if (((TCGReg)*(undefined8 *)pTVar27 & 0xff00) == 0x100) {
                  if (((TCGReg)*(undefined8 *)pTVar27 & 0xff) != TVar20) {
                    if (ppTVar2[TVar20] != (TCGTemp *)0x0) {
                      temp_sync(s,ppTVar2[TVar20],uVar22,0,-1);
                    }
                    tcg_out_mov(s,*(TCGReg *)pTVar27 >> 0x18,TVar20,*(TCGReg *)pTVar27 & 0xff);
                  }
                }
                else {
                  if (ppTVar2[TVar20] != (TCGTemp *)0x0) {
                    temp_sync(s,ppTVar2[TVar20],uVar22,0,-1);
                  }
                  temp_load(s,pTVar27,1 << ((byte)TVar20 & 0x1f),uVar22,0);
                }
                uVar22 = uVar22 | 1 << (TVar20 & TCG_REG_XMM15);
              }
              uVar43 = uVar43 + 4;
            } while (uVar64 << 2 != uVar43);
          }
          uVar64 = TVar53 >> 0x10;
          uVar43 = uVar24;
          if (uVar33 != 0) {
            do {
              if ((uVar64 >> ((byte)uVar43 & 0x1f) & 4) != 0) {
                temp_free_or_dead(s,(TCGTemp *)pTVar38->args[uVar43],1);
              }
              uVar43 = uVar43 + 1;
            } while (uVar43 < uVar51 + uVar33);
          }
          lVar37 = 0;
          do {
            if (((s->tcg_target_call_clobber_regs >> ((uint)lVar37 & 0x1f) & 1) != 0) &&
               (s->reg_to_temp[lVar37] != (TCGTemp *)0x0)) {
              temp_sync(s,s->reg_to_temp[lVar37],uVar22,0,-1);
            }
            lVar37 = lVar37 + 1;
          } while (lVar37 != 0x20);
          tcg_out_branch(s,1,ptVar8);
          if (uVar51 != 0) {
            uVar43 = 0;
            do {
              pTVar27 = (TCGTemp *)pTVar38->args[uVar43];
              if (((uint)*(ulong *)pTVar27 & 0xff00) == 0x100) {
                ppTVar2[*(ulong *)pTVar27 & 0xff] = (TCGTemp *)0x0;
              }
              *(ulong *)pTVar27 = *(ulong *)pTVar27 & 0xfffffff7ffff0000 | 0x100;
              *ppTVar2 = pTVar27;
              uVar33 = 4 << ((byte)uVar43 & 0x1f) & uVar64;
              if ((uVar64 >> ((uint)uVar43 & 0x1f) & 1) == 0) {
                if (uVar33 != 0) {
                  temp_free_or_dead(s,pTVar27,1);
                }
              }
              else {
                temp_sync(s,pTVar27,uVar22,0,uVar33);
              }
              uVar43 = uVar43 + 1;
            } while (uVar24 != uVar43);
          }
          goto LAB_005674d2;
        }
        tcg_gen_code_arm_cold_1();
        goto switchD_00568e8f_caseD_7;
      case INDEX_op_mov_i32:
        goto switchD_00566fc2_caseD_5;
      case INDEX_op_movi_i32:
switchD_00566fc2_caseD_6:
        tcg_gen_code_arm_cold_20();
        goto LAB_005674d7;
      }
switchD_00566fc2_caseD_3:
      tcg_op_supported_arm(TVar53 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64));
      uVar64 = TVar53 >> 0x10;
      pTVar11 = s->tcg_op_defs;
      uVar68 = (ulong)((TVar53 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) << 5);
      uVar43 = (ulong)(&pTVar11->nb_oargs)[uVar68];
      bVar17 = (&pTVar11->nb_iargs)[uVar68];
      uVar24 = (ulong)bVar17;
      lVar37 = (ulong)(&pTVar11->nb_oargs)[uVar68] * 8;
      pTVar60 = (TCGContext_conflict *)
                ((long)&stack0xfffffffffffffee8 + (ulong)((uint)bVar17 * 8) + lVar37);
      memcpy(pTVar60,(void *)((long)pTVar38->args + (ulong)((uint)bVar17 * 8) + lVar37),
             (ulong)(&pTVar11->nb_cargs)[uVar68] << 3);
      TVar34 = s->reserved_regs;
      allocated_regs = TVar34;
      if (bVar17 != 0) {
        uVar69 = 0;
        do {
          lVar37 = *(long *)((long)&pTVar11->args_ct + uVar68);
          lVar70 = *(long *)((long)&pTVar11->sorted_args + uVar68);
          iVar21 = *(int *)(lVar70 + uVar69 * 4 + uVar43 * 4);
          lVar66 = (long)iVar21;
          pTVar27 = (TCGTemp *)pTVar38->args[lVar66];
          uVar12 = *(ulong *)pTVar27;
          uVar33 = (uint)uVar12 & 0xff00;
          in_R9 = s;
          if (uVar33 == 0x300) {
            uVar57 = pTVar27->val;
            uVar5 = *(ushort *)(lVar37 + lVar66 * 8);
            pTVar60 = (TCGContext_conflict *)(ulong)uVar5;
            if (((((uVar5 & 2) == 0) && (((long)(int)uVar57 != uVar57 || ((uVar5 & 0x100) == 0))))
                && ((uVar57 >> 0x20 != 0 || ((uVar5 & 0x200) == 0)))) &&
               (((uVar57 + 0x80000000 >> 0x20 != 0 || ((uVar5 & 0x400) == 0)) &&
                (((uVar5 >> 0xb & 1) == 0 ||
                 (pTVar60 = (TCGContext_conflict *)(uVar12 >> 0x18),
                 (ulong)((char)(uVar12 >> 0x18) != '\0') * 0x20 + 0x20 != uVar57))))))
            goto LAB_005677b1;
            *(undefined4 *)((long)&stack0xffffffffffffff88 + lVar66 * 4) = 1;
            *(ulong *)((long)&stack0xfffffffffffffee8 + lVar66 * 8) = uVar57;
          }
          else {
LAB_005677b1:
            if ((*(byte *)(lVar37 + lVar66 * 8) & 0x40) == 0) {
              TVar46 = 0;
              preferred_regs = 0;
LAB_005677be:
              pTVar60 = s;
              temp_load(s,pTVar27,*(TCGRegSet *)(lVar37 + 4 + lVar66 * 8),allocated_regs,
                        preferred_regs);
              if ((*(uint *)(lVar37 + 4 + lVar66 * 8) >> (*(TCGReg *)pTVar27 & TCG_REG_XMM15) & 1)
                  == 0) goto LAB_00567879;
              TVar20 = *(TCGReg *)pTVar27 & 0xff;
            }
            else {
              bVar17 = *(byte *)(lVar37 + 2 + lVar66 * 8);
              TVar46 = pTVar38->output_pref[bVar17];
              if ((uVar12 & 0x100000000) == 0) {
                uVar51 = uVar64 >> ((byte)iVar21 & 0x1f);
                pTVar60 = (TCGContext_conflict *)(ulong)uVar51;
                if ((uVar51 & 4) != 0) {
                  preferred_regs = TVar46;
                  if (uVar33 == 0x100) {
                    iVar21 = 0;
                    if (uVar69 != 0) {
                      uVar57 = 0;
                      do {
                        pTVar60 = (TCGContext_conflict *)
                                  (long)*(int *)(lVar70 + uVar43 * 4 + uVar57 * 4);
                        if (((*(byte *)(lVar37 + (long)pTVar60 * 8) & 0x40) != 0) &&
                           ((uVar12 & 0xff) ==
                            *(ulong *)((long)&stack0xfffffffffffffee8 + (long)pTVar60 * 8))) {
                          iVar21 = 5;
                          break;
                        }
                        uVar57 = uVar57 + 1;
                      } while (uVar69 != uVar57);
                    }
                    if (iVar21 == 5) goto LAB_00567879;
                    if (iVar21 != 0) goto LAB_00567915;
                  }
                  goto LAB_005677be;
                }
              }
              else {
                preferred_regs = 0;
                if (pTVar27 == (TCGTemp *)pTVar38->args[bVar17]) goto LAB_005677be;
              }
LAB_00567879:
              temp_load(s,pTVar27,s->tcg_target_available_regs[(byte)pTVar27->field_0x3],
                        allocated_regs,0);
              TVar20 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar37 + 4 + lVar66 * 8),allocated_regs,TVar46
                                     ,((undefined1  [56])*pTVar27 & (undefined1  [56])0x400000000)
                                      != (undefined1  [56])0x0);
              pTVar60 = s;
              tcg_out_mov(s,*(TCGReg *)pTVar27 >> 0x18,TVar20,*(TCGReg *)pTVar27 & 0xff);
            }
            *(ulong *)((long)&stack0xfffffffffffffee8 + lVar66 * 8) = (ulong)TVar20;
            *(undefined4 *)((long)&stack0xffffffffffffff88 + lVar66 * 4) = 0;
            allocated_regs = allocated_regs | 1 << (TVar20 & TCG_REG_XMM15);
          }
LAB_00567915:
          uVar69 = uVar69 + 1;
        } while (uVar69 != uVar24);
      }
      if (uVar24 != 0) {
        uVar69 = uVar43;
        do {
          if ((uVar64 >> ((byte)uVar69 & 0x1f) & 4) != 0) {
            pTVar60 = s;
            temp_free_or_dead(s,(TCGTemp *)pTVar38->args[uVar69],1);
          }
          uVar69 = uVar69 + 1;
        } while (uVar69 < uVar24 + uVar43);
      }
      if (((&pTVar11->flags)[uVar68] & 2) == 0) {
        if (((&pTVar11->flags)[uVar68] & 4) != 0) {
          lVar37 = 0;
          do {
            if (((s->tcg_target_call_clobber_regs >> ((uint)lVar37 & 0x1f) & 1) != 0) &&
               (s->reg_to_temp[lVar37] != (TCGTemp *)0x0)) {
              pTVar60 = s;
              temp_sync(s,s->reg_to_temp[lVar37],allocated_regs,0,-1);
            }
            lVar37 = lVar37 + 1;
          } while (lVar37 != 0x20);
        }
        if (uVar43 != 0) {
          uVar24 = 0;
          do {
            lVar37 = *(long *)((long)&pTVar11->args_ct + uVar68);
            lVar70 = (long)*(int *)(*(long *)((long)&pTVar11->sorted_args + uVar68) + uVar24 * 4);
            pTVar27 = (TCGTemp *)pTVar38->args[lVar70];
            uVar5 = *(ushort *)(lVar37 + lVar70 * 8);
            if (((char)uVar5 < '\0') &&
               (uVar69 = (ulong)*(byte *)(lVar37 + 2 + lVar70 * 8),
               *(int *)((long)&stack0xffffffffffffff88 + uVar69 * 4) == 0)) {
              TVar20 = *(TCGReg *)((long)&stack0xfffffffffffffee8 + uVar69 * 8);
            }
            else {
              if ((uVar5 & 0x20) == 0) {
                TVar46 = pTVar38->output_pref[uVar24];
                uVar33 = TVar34;
              }
              else {
                uVar33 = TVar34 | allocated_regs;
                TVar46 = pTVar38->output_pref[uVar24];
              }
              pTVar60 = s;
              TVar20 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar37 + 4 + lVar70 * 8),uVar33,TVar46,
                                     ((undefined1  [56])*pTVar27 & (undefined1  [56])0x400000000) !=
                                     (undefined1  [56])0x0);
            }
            if (((uint)*(ulong *)pTVar27 & 0xff00) == 0x100) {
              ppTVar2[*(ulong *)pTVar27 & 0xff] = (TCGTemp *)0x0;
            }
            TVar34 = TVar34 | 1 << (TVar20 & TCG_REG_XMM15);
            *(ulong *)pTVar27 =
                 (*(ulong *)pTVar27 & 0xfffffff7ffff0000) + (ulong)(byte)TVar20 + 0x100;
            ppTVar2[TVar20] = pTVar27;
            *(ulong *)((long)&stack0xfffffffffffffee8 + lVar70 * 8) = (ulong)TVar20;
            uVar24 = uVar24 + 1;
          } while (uVar43 != uVar24);
        }
      }
      uVar51 = local_70;
      pTVar52 = local_108;
      pTVar48 = local_118;
      uVar33 = *(uint *)pTVar38;
      r = (TCGCond)local_118;
      bVar17 = (byte)local_110;
      base = (TCGCond)local_110;
      bVar45 = (byte)local_118;
      bVar63 = (byte)local_108;
      TVar36 = (TCGCond)local_108;
      pTVar39 = local_110;
      pTVar71 = local_110;
      if (((&pTVar11->flags)[uVar68] & 0x40) != 0) {
        if (0x2b < (uVar33 & 0xff) - 0x8d) {
switchD_00567bb2_caseD_93:
          pcVar23 = 
          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
          ;
          iVar21 = 0xb75;
LAB_00569136:
          g_assertion_message_expr(pcVar23,iVar21,(char *)0x0);
        }
        uVar51 = uVar33 >> 0xc & 0xf;
        uVar24 = (ulong)uVar51;
        TVar54 = (uVar33 >> 8 & 0xf) + TCG_TYPE_V64;
        iVar21 = (int)in_R9;
        switch(uVar33 & 0xff) {
        case 0x8d:
          goto LAB_0056844a;
        case 0x8e:
          goto LAB_00568b50;
        case 0x8f:
          in_R9 = local_108;
          tcg_out_dupm_vec(s,TVar54,uVar51,r,base,(intptr_t)local_108);
          goto LAB_005681f0;
        case 0x90:
          uVar33 = *(uint *)(tcg_out_vec_op_add_insn + uVar24 * 4);
          pTVar71 = local_108;
          TVar36 = base;
          goto LAB_005681b6;
        case 0x91:
          puVar40 = tcg_out_vec_op_sub_insn;
          break;
        case 0x92:
          puVar40 = tcg_out_vec_op_mul_insn;
          break;
        default:
          goto switchD_00567bb2_caseD_93;
        case 0x94:
          uVar33 = *(uint *)(tcg_out_vec_op_abs_insn + uVar24 * 4);
          TVar36 = TCG_COND_NEVER;
          goto LAB_005681b6;
        case 0x95:
          puVar40 = tcg_out_vec_op_ssadd_insn;
          break;
        case 0x96:
          puVar40 = tcg_out_vec_op_usadd_insn;
          break;
        case 0x97:
          puVar40 = tcg_out_vec_op_sssub_insn;
          break;
        case 0x98:
          puVar40 = tcg_out_vec_op_ussub_insn;
          break;
        case 0x99:
          puVar40 = tcg_out_vec_op_smin_insn;
          break;
        case 0x9a:
          puVar40 = tcg_out_vec_op_umin_insn;
          break;
        case 0x9b:
          puVar40 = tcg_out_vec_op_smax_insn;
          break;
        case 0x9c:
          puVar40 = tcg_out_vec_op_umax_insn;
          break;
        case 0x9d:
          uVar33 = 0x5db;
          pTVar71 = local_108;
          TVar36 = base;
          goto LAB_005681b6;
        case 0x9e:
          uVar33 = 0x5eb;
          pTVar71 = local_108;
          TVar36 = base;
          goto LAB_005681b6;
        case 0x9f:
          uVar33 = 0x5ef;
          pTVar71 = local_108;
          TVar36 = base;
          goto LAB_005681b6;
        case 0xa0:
          uVar22 = (uint)(TVar54 == TCG_TYPE_V256) << 0x13 | 0x5df;
          goto LAB_005681cd;
        case 0xa3:
          iVar65 = 6;
          goto LAB_00567e3a;
        case 0xa4:
          iVar65 = 2;
          goto LAB_00567e3a;
        case 0xa5:
          iVar65 = 4;
LAB_00567e3a:
          uVar33 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar24 * 4) | 0x80000;
          if (TVar54 != TCG_TYPE_V256) {
            uVar33 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar24 * 4);
          }
          tcg_out_vex_opc(s,uVar33,iVar65,r,base,iVar21);
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = (bVar17 & 7) + (char)iVar65 * '\b' | 0xc0;
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = bVar63;
          goto LAB_005681f0;
        case 0xa6:
          puVar40 = tcg_out_vec_op_shls_insn;
          break;
        case 0xa7:
          puVar40 = tcg_out_vec_op_shrs_insn;
          break;
        case 0xa8:
          puVar40 = tcg_out_vec_op_sars_insn;
          break;
        case 0xa9:
          puVar40 = tcg_out_vec_op_shlv_insn;
          break;
        case 0xaa:
          puVar40 = tcg_out_vec_op_shrv_insn;
          break;
        case 0xab:
          puVar40 = tcg_out_vec_op_sarv_insn;
          break;
        case 0xac:
          if (_local_100 == TCG_COND_GT) {
            puVar40 = tcg_out_vec_op_cmpgt_insn;
          }
          else {
            if (_local_100 != TCG_COND_EQ) {
              pcVar23 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
              ;
              iVar21 = 0xb20;
              goto LAB_00569136;
            }
            puVar40 = tcg_out_vec_op_cmpeq_insn;
          }
          break;
        case 0xb0:
          uVar33 = 0x1c6;
          goto LAB_00567fd7;
        case 0xb1:
          tcg_out_vex_opc(s,(uint)(TVar54 == TCG_TYPE_V256) << 0x13 | 0x1044c,r,base,TVar36,iVar21);
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = (bVar63 & 7) + bVar45 * '\b' | 0xc0;
          tVar16 = local_100 << 4;
          goto LAB_00568881;
        case 0xb2:
          uVar33 = 0x1040e;
          if (uVar51 != 1) {
            if (uVar51 != 2) {
              pcVar23 = 
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
              ;
              iVar21 = 0xb53;
              goto LAB_00569136;
            }
            uVar33 = 0x1040c;
            if (have_avx2_arm != false) {
              uVar33 = 0x10402;
            }
          }
          goto LAB_00567fd7;
        case 0xb3:
          puVar40 = tcg_out_vec_op_packss_insn;
          break;
        case 0xb4:
          puVar40 = tcg_out_vec_op_packus_insn;
          break;
        case 0xb5:
          tcg_out_vex_opc(s,0x573,3,r,base,iVar21);
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = bVar17 & 7 | 0xd8;
          goto LAB_005682e4;
        case 0xb6:
          uVar33 = 0x90446;
LAB_00567fd7:
          tVar16 = local_100;
          uVar51 = uVar33 | 0x80000;
          if (TVar54 != TCG_TYPE_V256) {
            uVar51 = uVar33;
          }
          tcg_out_vex_opc(s,uVar51,r,base,TVar36,iVar21);
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = (bVar63 & 7) + bVar45 * '\b' | 0xc0;
          ptVar8 = s->code_ptr;
          s->code_ptr = ptVar8 + 1;
          *ptVar8 = tVar16;
          goto LAB_005681f0;
        case 0xb7:
          puVar40 = tcg_out_vec_op_punpckl_insn;
          break;
        case 0xb8:
          puVar40 = tcg_out_vec_op_punpckh_insn;
        }
        uVar33 = *(uint *)(puVar40 + uVar24 * 4);
        pTVar71 = local_108;
        TVar36 = base;
LAB_005681b6:
        uVar22 = uVar33 | 0x80000;
        if (TVar54 != TCG_TYPE_V256) {
          uVar22 = uVar33;
        }
        pTVar39 = (TCGContext_conflict *)((ulong)pTVar71 & 0xffffffff);
LAB_005681cd:
        tcg_out_vex_opc(s,uVar22,r,TVar36,(int)pTVar39,(int)in_R9);
        TVar36 = (TCGCond)pTVar71;
        goto LAB_005681d2;
      }
      uVar35 = (uVar33 & 0xff) - 3;
      if (0x85 < uVar35) {
switchD_00567b56_caseD_5:
        tcg_gen_code_arm_cold_21();
LAB_0056916c:
        tcg_gen_code_arm_cold_2();
        uVar64 = pTVar60->nb_globals;
        uVar33 = pTVar60->nb_temps;
        uVar22 = uVar33 * 4 + 7;
        uVar51 = uVar33 * 4 + 0xe;
        if (-1 < (int)uVar22) {
          uVar51 = uVar22;
        }
        puVar30 = pTVar60->pool_cur;
        if (pTVar60->pool_end < puVar30 + (int)(uVar51 & 0xfffffff8)) {
          puVar30 = (uint8_t *)tcg_malloc_internal_arm(pTVar60,uVar51 & 0xfffffff8);
        }
        else {
          pTVar60->pool_cur = puVar30 + (int)(uVar51 & 0xfffffff8);
        }
        if (0 < (int)uVar33) {
          lVar37 = 0;
          do {
            *(uint8_t **)((long)&pTVar60->temps[0].state_ptr + lVar37) = puVar30;
            puVar30 = puVar30 + 4;
            lVar37 = lVar37 + 0x38;
          } while ((ulong)uVar33 * 0x38 - lVar37 != 0);
        }
        la_func_end(pTVar60,uVar64,uVar33);
        pQVar31 = ((pTVar60->ops).tqh_circ.tql_prev)->tql_prev;
        if ((TCGOp *)pQVar31->tql_next == (TCGOp *)0x0) goto LAB_00569881;
        lVar37 = (ulong)uVar64 * 0x38;
        pTVar38 = (TCGOp *)pQVar31->tql_next;
        do {
          pTVar6 = (TCGOp *)((pTVar38->link).tqe_circ.tql_prev)->tql_prev->tql_next;
          uVar51 = *(uint *)pTVar38;
          uVar22 = uVar51 & 0xff;
          uVar35 = uVar22 << 5;
          pTVar11 = pTVar60->tcg_op_defs;
          if (uVar22 < 0x7b) {
            if (0x27 < uVar22) {
              uVar58 = 0x13;
              if (1 < uVar22 - 0x29) {
                if (uVar22 == 0x28) {
                  uVar58 = 0x12;
                  goto LAB_005692f6;
                }
                goto switchD_005692a3_caseD_7f;
              }
LAB_005692b9:
              pQVar41 = (QTailQLink *)&DAT_00000002;
              uVar55 = 2;
              if (*(long *)(pTVar38->args[1] + 0x28) == 1) {
                TVar44 = pTVar38->args[0];
                lVar70 = 0x30;
                goto LAB_0056930c;
              }
              goto LAB_00569359;
            }
            if (uVar22 != 0) {
              if (uVar22 != 2) {
                uVar58 = 0x11;
                if (uVar22 == 0x27) goto LAB_005692f6;
                goto switchD_005692a3_caseD_7f;
              }
              uVar22 = uVar51 >> 0xc & 0xf;
              uVar24 = (ulong)uVar22;
              uVar51 = uVar51 >> 8 & 0xf;
              TVar44 = pTVar38->args[(ulong)(uVar51 + uVar22) + 1];
              if ((TVar44 & 4) == 0) {
LAB_0056958c:
                if (uVar22 == 0) {
                  uVar35 = 0;
                }
                else {
                  uVar43 = 0;
                  uVar35 = 0;
                  do {
                    TVar7 = pTVar38->args[uVar43];
                    uVar58 = 0;
                    if ((*(ulong *)(TVar7 + 0x28) & 1) != 0) {
                      uVar58 = 4 << ((byte)uVar43 & 0x1f);
                    }
                    uVar55 = 0;
                    if ((*(ulong *)(TVar7 + 0x28) & 2) != 0) {
                      uVar55 = 1 << ((byte)uVar43 & 0x1f);
                    }
                    uVar35 = uVar35 | uVar55 | uVar58;
                    *(undefined8 *)(TVar7 + 0x28) = 1;
                    **(undefined4 **)(TVar7 + 0x30) = 0;
                    pTVar38->output_pref[uVar43] = 0;
                    uVar43 = uVar43 + 1;
                  } while (uVar24 != uVar43);
                }
                uVar50 = (undefined2)uVar35;
                if ((TVar44 & 3) == 0) {
                  if (0 < (int)uVar64) {
                    lVar70 = 0;
                    do {
                      *(undefined8 *)((long)&pTVar60->temps[0].state + lVar70) = 3;
                      **(TCGRegSet **)((long)&pTVar60->temps[0].state_ptr + lVar70) =
                           pTVar60->tcg_target_available_regs
                           [(byte)(&pTVar60->temps[0].field_0x3)[lVar70]];
                      lVar70 = lVar70 + 0x38;
                    } while (lVar37 != lVar70);
                  }
                }
                else if ((TVar44 & 1) == 0) {
                  la_global_sync(pTVar60,uVar64);
                }
                uVar43 = uVar24;
                if (uVar51 != 0) {
                  do {
                    if ((pTVar38->args[uVar43] != 0) &&
                       ((*(byte *)(pTVar38->args[uVar43] + 0x28) & 1) != 0)) {
                      uVar35 = uVar35 | 4 << ((byte)uVar43 & 0x1f);
                    }
                    uVar50 = (undefined2)uVar35;
                    uVar43 = uVar43 + 1;
                  } while (uVar43 < uVar51 + uVar22);
                }
                la_cross_call(pTVar60,uVar33);
                pQVar31 = (QTailQLink *)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
                if (uVar51 != 0) {
                  uVar43 = 0;
                  do {
                    TVar44 = pTVar38->args[uVar24 + uVar43];
                    if ((TVar44 != 0) && (uVar68 = *(ulong *)(TVar44 + 0x28), (uVar68 & 1) != 0)) {
                      TVar34 = 0;
                      if (5 < uVar43) {
                        TVar34 = pTVar60->tcg_target_available_regs[*(byte *)(TVar44 + 3)];
                      }
                      **(TCGRegSet **)(TVar44 + 0x30) = TVar34;
                      *(ulong *)(TVar44 + 0x28) = uVar68 & 0xfffffffffffffffe;
                    }
                    uVar43 = uVar43 + 1;
                  } while (uVar51 != uVar43);
                  if (5 < uVar51) {
                    uVar51 = 6;
                  }
                  uVar43 = 0;
                  do {
                    lVar70 = *(long *)((long)pTVar38->args + uVar43 * 2 + uVar24 * 8);
                    if (lVar70 != 0) {
                      puVar14 = *(uint **)(lVar70 + 0x30);
                      *puVar14 = *puVar14 |
                                 1 << (*(byte *)((long)tcg_target_call_iarg_regs + uVar43) & 0x1f);
                    }
                    uVar43 = uVar43 + 4;
                  } while (uVar51 << 2 != uVar43);
                }
              }
              else {
                if (uVar22 != 0) {
                  uVar43 = 0;
                  do {
                    if (*(long *)(pTVar38->args[uVar43] + 0x28) != 1) goto LAB_0056958c;
                    uVar43 = uVar43 + 1;
                  } while (uVar24 != uVar43);
                }
                uVar50 = 0;
                pQVar31 = (QTailQLink *)0x0;
              }
              if ((char)pQVar31 != '\0') goto LAB_00569621;
              goto LAB_00569315;
            }
            TVar44 = pTVar38->args[0];
            *(undefined8 *)(TVar44 + 0x28) = 1;
            pQVar31 = *(QTailQLink **)(TVar44 + 0x30);
            *(undefined4 *)&pQVar31->tql_next = 0;
switchD_005692a3_caseD_81:
            uVar50 = 0;
          }
          else {
            if (uVar22 - 0x7b < 7) {
              pQVar31 = (QTailQLink *)
                        ((long)&switchD_005692a3::switchdataD_00d6e5e8 +
                        (long)(int)(&switchD_005692a3::switchdataD_00d6e5e8)[uVar22 - 0x7b]);
              switch(uVar22) {
              case 0x7b:
                uVar58 = 0x4e;
                break;
              case 0x7c:
                uVar58 = 0x4f;
                break;
              default:
                uVar58 = 0x50;
                goto LAB_005692b9;
              case 0x7f:
              case 0x80:
                goto switchD_005692a3_caseD_7f;
              case 0x81:
                goto switchD_005692a3_caseD_81;
              }
LAB_005692f6:
              if (*(long *)(pTVar38->args[1] + 0x28) == 1) {
                TVar44 = pTVar38->args[0];
                lVar70 = 0x38;
LAB_0056930c:
                if (*(long *)(TVar44 + 0x28) == 1) goto LAB_00569313;
                *(uint *)pTVar38 = uVar51 & 0xffffff00 | uVar58;
                pTVar38->args[1] = pTVar38->args[2];
                pTVar38->args[2] = *(TCGArg *)((long)pTVar38->args + lVar70 + -0x18);
                uVar55 = 2;
                pQVar41 = (QTailQLink *)&DAT_00000001;
                uVar22 = uVar58;
              }
              else {
                uVar55 = 4;
                pQVar41 = (QTailQLink *)&DAT_00000002;
              }
            }
            else {
switchD_005692a3_caseD_7f:
              bVar17 = (&pTVar11->nb_oargs)[uVar35];
              pQVar41 = (QTailQLink *)(ulong)bVar17;
              uVar55 = (uint)(&pTVar11->nb_iargs)[uVar35];
              if (bVar17 != 0 && ((&pTVar11->flags)[uVar35] & 8) == 0) {
                uVar24 = 0;
                do {
                  if (*(long *)(pTVar38->args[uVar24] + 0x28) != 1) goto LAB_00569359;
                  uVar24 = uVar24 + 1;
                } while (bVar17 != uVar24);
LAB_00569313:
                uVar50 = 0;
LAB_00569315:
                tcg_op_remove_arm(pTVar60,pTVar38);
                pQVar31 = extraout_RAX;
                goto LAB_00569621;
              }
            }
LAB_00569359:
            if ((char)pQVar41 == '\0') {
              uVar51 = 0;
            }
            else {
              pQVar31 = (QTailQLink *)0x0;
              uVar51 = 0;
              do {
                TVar44 = pTVar38->args[(long)pQVar31];
                pTVar13 = *(TCGRegSet **)(TVar44 + 0x30);
                pTVar38->output_pref[(long)pQVar31] = *pTVar13;
                uVar58 = 4 << ((byte)pQVar31 & 0x1f);
                if ((*(ulong *)(TVar44 + 0x28) & 1) == 0) {
                  uVar58 = 0;
                }
                uVar61 = 1 << ((byte)pQVar31 & 0x1f);
                if ((*(ulong *)(TVar44 + 0x28) & 2) == 0) {
                  uVar61 = 0;
                }
                uVar51 = uVar51 | uVar61 | uVar58;
                *(undefined8 *)(TVar44 + 0x28) = 1;
                *pTVar13 = 0;
                pQVar31 = (QTailQLink *)((long)&pQVar31->tql_next + 1);
              } while (pQVar41 != pQVar31);
            }
            bVar17 = (&pTVar11->flags)[uVar35];
            if ((bVar17 & 1) == 0) {
              if ((bVar17 & 2) == 0) {
                if (((bVar17 & 8) != 0) &&
                   (la_global_sync(pTVar60,uVar64), ((&pTVar11->flags)[uVar35] & 4) != 0)) {
                  la_cross_call(pTVar60,uVar33);
                }
              }
              else if (uVar22 == 0x26) {
                if (0 < (int)uVar64) {
                  lVar70 = 0;
                  do {
                    pbVar29 = (byte *)((long)&pTVar60->temps[0].state + lVar70);
                    *pbVar29 = *pbVar29 | 2;
                    lVar70 = lVar70 + 0x38;
                  } while (lVar37 != lVar70);
                }
              }
              else {
                if (0 < (int)uVar64) {
                  lVar70 = 0;
                  do {
                    *(undefined8 *)((long)&pTVar60->temps[0].state + lVar70) = 3;
                    **(TCGRegSet **)((long)&pTVar60->temps[0].state_ptr + lVar70) =
                         pTVar60->tcg_target_available_regs
                         [(byte)(&pTVar60->temps[0].field_0x3)[lVar70]];
                    lVar70 = lVar70 + 0x38;
                  } while (lVar37 != lVar70);
                }
                ppvVar32 = &pTVar60->temps[(int)uVar64].state_ptr;
                lVar70 = (long)(int)uVar33 - (long)(int)uVar64;
                if ((int)uVar64 < (int)uVar33) {
                  do {
                    uVar24 = *(ulong *)(ppvVar32 + -6) & 0x4000000000;
                    TVar34 = 0;
                    ppvVar32[-1] = (void *)((uVar24 >> 0x26) * 2 + 1);
                    if (uVar24 != 0) {
                      TVar34 = pTVar60->tcg_target_available_regs
                               [*(ulong *)(ppvVar32 + -6) >> 0x18 & 0xff];
                    }
                    *(TCGRegSet *)*ppvVar32 = TVar34;
                    ppvVar32 = ppvVar32 + 7;
                    lVar70 = lVar70 + -1;
                  } while (lVar70 != 0);
                }
              }
            }
            else {
              la_func_end(pTVar60,uVar64,uVar33);
            }
            pQVar31 = (QTailQLink *)(ulong)((int)pQVar41 + uVar55);
            pQVar42 = pQVar41;
            if (uVar55 != 0) {
              do {
                uVar58 = 0;
                if ((*(byte *)(pTVar38->args[(long)pQVar42] + 0x28) & 1) != 0) {
                  uVar58 = 4 << ((byte)pQVar42 & 0x1f);
                }
                uVar51 = uVar51 | uVar58;
                pQVar42 = (QTailQLink *)((long)&pQVar42->tql_next + 1);
              } while (pQVar42 < pQVar31);
            }
            uVar50 = (undefined2)uVar51;
            pQVar42 = pQVar41;
            if (uVar55 != 0) {
              do {
                TVar44 = pTVar38->args[(long)pQVar42];
                uVar24 = *(ulong *)(TVar44 + 0x28);
                if ((uVar24 & 1) != 0) {
                  **(TCGRegSet **)(TVar44 + 0x30) =
                       pTVar60->tcg_target_available_regs[*(byte *)(TVar44 + 3)];
                  *(ulong *)(TVar44 + 0x28) = uVar24 & 0xfffffffffffffffe;
                }
                pQVar42 = (QTailQLink *)((long)&pQVar42->tql_next + 1);
              } while (pQVar42 < pQVar31);
            }
            if ((uVar22 == 5) || (uVar22 == 0x3f)) {
              if ((uVar51 & 8) != 0) {
                pQVar31 = *(QTailQLink **)(pTVar38->args[0] + 0x30);
                *(undefined4 *)&pQVar31->tql_next = **(undefined4 **)(pTVar38->args[1] + 0x30);
              }
            }
            else if (uVar55 != 0) {
              lVar70 = *(long *)((long)&pTVar11->args_ct + (ulong)uVar35);
              do {
                puVar14 = *(uint **)(pTVar38->args[(long)pQVar41] + 0x30);
                uVar51 = *(uint *)(lVar70 + 4 + (long)pQVar41 * 8);
                uVar22 = *puVar14 & uVar51;
                if ((*(byte *)(lVar70 + (long)pQVar41 * 8) & 0x40) != 0) {
                  uVar22 = uVar22 & pTVar38->output_pref[*(byte *)(lVar70 + 2 + (long)pQVar41 * 8)];
                }
                if (uVar22 != 0) {
                  uVar51 = uVar22;
                }
                *puVar14 = uVar51;
                pQVar41 = (QTailQLink *)((long)&pQVar41->tql_next + 1);
              } while (pQVar41 < pQVar31);
            }
          }
LAB_00569621:
          *(undefined2 *)&pTVar38->field_0x2 = uVar50;
          pTVar38 = pTVar6;
          if (pTVar6 == (TCGOp *)0x0) {
LAB_00569881:
            return (int)pQVar31;
          }
        } while( true );
      }
      pTVar62 = (TCGContext_conflict *)(ulong)local_70;
      iVar65 = 0x402f7;
      pTVar49 = (TCGContext_conflict *)0x5;
      iVar47 = 5;
      in_R9 = (TCGContext_conflict *)0x0;
      uVar22 = 0;
      uVar55 = 0;
      iVar21 = 5;
      uVar58 = 0;
      switch(uVar33 & 0xff) {
      case 3:
        tcg_out_jxx(s,-1,(TCGLabel *)local_118,
                    (&switchD_00567b56::switchdataD_00d6e3b0)[uVar35] + 0xd6e3b0);
        break;
      case 4:
        tcg_out_mb(s,(TCGArg)local_118);
        break;
      default:
        goto switchD_00567b56_caseD_5;
      case 7:
        tcg_out_setcond32(s,_local_100,(TCGArg)local_118,(TCGArg)local_110,(TCGArg)local_108,
                          local_70);
        in_R9 = pTVar62;
        break;
      case 8:
        in_stack_fffffffffffffe58 = (TCGContext_conflict *)(ulong)_local_100;
        tcg_out_movcond32(s,local_f0,r,base,(TCGArg)local_108,local_70,_local_100);
        in_R9 = pTVar62;
        break;
      case 9:
      case 0x43:
        iVar21 = 0x1b6;
        goto LAB_00568812;
      case 10:
        iVar21 = 0x1be;
        goto LAB_00568812;
      case 0xb:
      case 0x45:
        iVar21 = 0x1b7;
        goto LAB_00568812;
      case 0xc:
        iVar21 = 0x1bf;
        goto LAB_00568812;
      case 0xd:
      case 0x47:
        TVar54 = TCG_TYPE_I32;
        goto LAB_0056844a;
      case 0xe:
      case 0x4a:
        if (local_78 == 0) {
          iVar21 = 0x2088;
          goto LAB_00568812;
        }
        tcg_out_modrm_offset(s,0xc6,0,base,(intptr_t)local_108);
        pbVar29 = s->code_ptr;
        s->code_ptr = pbVar29 + 1;
        *pbVar29 = bVar45;
        break;
      case 0xf:
      case 0x4b:
        if (local_78 == 0) {
          iVar21 = 0x489;
          goto LAB_00568812;
        }
        tcg_out_modrm_offset(s,0x4c7,0,base,(intptr_t)local_108);
        ptVar8 = s->code_ptr;
        *(short *)ptVar8 = (short)pTVar48;
        pTVar28 = (TCGCond *)(ptVar8 + 2);
        goto LAB_00568acf;
      case 0x10:
      case 0x4c:
        if (local_78 != 0) {
          iVar21 = 199;
          goto LAB_005684d4;
        }
        TVar54 = TCG_TYPE_I32;
LAB_00568b50:
        tcg_out_st(s,TVar54,r,base,(intptr_t)local_108);
        break;
      case 0x11:
        goto switchD_00567b56_caseD_11;
      case 0x12:
        goto switchD_00567b56_caseD_12;
      case 0x13:
        goto switchD_00567b56_caseD_13;
      case 0x18:
        goto switchD_00567b56_caseD_18;
      case 0x19:
        goto switchD_00567b56_caseD_19;
      case 0x1a:
        iVar47 = 4;
        uVar22 = 0;
        goto switchD_00567b56_caseD_12;
      case 0x1b:
        iVar47 = 1;
        goto switchD_00567b56_caseD_12;
      case 0x1c:
        iVar47 = 6;
        goto switchD_00567b56_caseD_12;
      case 0x1d:
        goto switchD_00567b56_caseD_1d;
      case 0x1e:
        goto switchD_00567b56_caseD_1e;
      case 0x1f:
        uVar22 = 0;
        goto LAB_00568625;
      case 0x20:
        goto switchD_00567b56_caseD_20;
      case 0x21:
        in_R9 = (TCGContext_conflict *)&DAT_00000001;
switchD_00567b56_caseD_20:
        pTVar49 = in_R9;
        uVar22 = 0;
        goto LAB_00568715;
      case 0x22:
      case 0x5f:
        lVar37 = CONCAT44(uStack_fc,_local_100);
        uVar24 = CONCAT44(uStack_f4,local_f8) ^ 8;
        if (lVar37 == 0 && uVar24 == 0) {
          tcg_gen_code_arm_cold_9();
          break;
        }
        if (lVar37 == 8 && uVar24 == 0) {
          tcg_gen_code_arm_cold_4();
          break;
        }
        if ((lVar37 == 0) && (CONCAT44(uStack_f4,local_f8) == 0x10)) {
          tcg_gen_code_arm_cold_8();
          break;
        }
        goto LAB_0056916c;
      case 0x23:
switchD_00567b56_caseD_23:
        if (local_118 < (TCGContext_conflict *)0x8 && local_110 < (TCGContext_conflict *)0x4) {
          iVar21 = 0x1b6;
          goto LAB_005685c4;
        }
        tcg_out_ext16u(s,r,base);
        uVar22 = 5;
LAB_00568b1d:
        TVar36 = TCG_COND_EQ;
        goto LAB_00568729;
      case 0x24:
        if ((TCGContext_conflict *)0x7 < local_118 || (TCGContext_conflict *)0x3 < local_110) {
          tcg_out_opc(s,0x1bf,r,base,0);
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = (bVar17 & 7) + bVar45 * '\b' | 0xc0;
          uVar22 = 7;
          goto LAB_00568b1d;
        }
        iVar21 = 0x1be;
LAB_005685c4:
        tcg_out_opc(s,iVar21,r,base | TCG_COND_LTU,0);
        bVar17 = bVar17 + bVar45 * '\b' + 4;
        goto LAB_005681da;
      case 0x25:
        iVar21 = 0x1ac;
        goto LAB_00568846;
      case 0x26:
        in_R9 = (TCGContext_conflict *)CONCAT44(uStack_fc,_local_100);
        tcg_out_brcond32(s,TVar36,(TCGArg)local_118,(TCGArg)local_110,local_74,(TCGLabel *)in_R9,
                         (int)in_stack_fffffffffffffe58);
        break;
      case 0x27:
        goto switchD_00567b56_caseD_27;
      case 0x28:
        goto switchD_00567b56_caseD_28;
      case 0x29:
        goto switchD_00567b56_caseD_29;
      case 0x2a:
        goto switchD_00567b56_caseD_2a;
      case 0x2f:
        goto switchD_00567b56_caseD_2f;
      case 0x30:
        goto switchD_00567b56_caseD_30;
      case 0x31:
      case 0x6b:
        tcg_out_ext8u(s,r,base);
        break;
      case 0x32:
      case 0x6c:
        tcg_out_ext16u(s,r,base);
        break;
      case 0x33:
      case 0x6e:
        tcg_out_rolw_8(s,r);
        break;
      case 0x34:
      case 0x6f:
        tcg_gen_code_arm_cold_15();
        break;
      case 0x35:
        goto switchD_00567b56_caseD_35;
      case 0x36:
        goto switchD_00567b56_caseD_36;
      case 0x37:
        uVar33 = 0;
        goto LAB_005687cc;
      case 0x3c:
        iVar21 = 0;
        goto LAB_005685e6;
      case 0x3d:
        iVar21 = 0;
        goto LAB_00568778;
      case 0x3e:
        goto LAB_00568ce2;
      case 0x41:
        tcg_out_setcond64(s,_local_100,(TCGArg)local_118,(TCGArg)local_110,(TCGArg)local_108,
                          local_70);
        in_R9 = pTVar62;
        break;
      case 0x42:
        in_stack_fffffffffffffe58 = (TCGContext_conflict *)(ulong)_local_100;
        tcg_out_movcond64(s,local_f0,r,base,(TCGArg)local_108,local_70,_local_100);
        in_R9 = pTVar62;
        break;
      case 0x44:
        iVar21 = 0x11be;
        goto LAB_00568812;
      case 0x46:
        iVar21 = 0x11bf;
        goto LAB_00568812;
      case 0x48:
        iVar21 = 0x1063;
LAB_00568812:
        tcg_out_modrm_offset(s,iVar21,r,base,(intptr_t)local_108);
        break;
      case 0x49:
        TVar54 = TCG_TYPE_I64;
LAB_0056844a:
        tcg_out_ld(s,TVar54,r,base,(intptr_t)local_108);
        break;
      case 0x4d:
        if (local_78 == 0) {
          TVar54 = TCG_TYPE_I64;
          goto LAB_00568b50;
        }
        iVar21 = 0x10c7;
LAB_005684d4:
        tcg_out_modrm_offset(s,iVar21,0,base,(intptr_t)local_108);
        pTVar28 = (TCGCond *)s->code_ptr;
        *pTVar28 = r;
        goto LAB_00568acb;
      case 0x4e:
        in_R9 = (TCGContext_conflict *)0x1000;
switchD_00567b56_caseD_11:
        uVar22 = (uint)in_R9;
        iVar47 = 0;
        if (local_118 == local_110) goto switchD_00567b56_caseD_12;
        if (local_70 == 0) {
          TVar36 = base;
          if (local_118 == local_108) {
LAB_00568a8b:
            tgen_arithr(s,uVar22,r,TVar36);
            break;
          }
          in_stack_fffffffffffffe58 = (TCGContext_conflict *)0x0;
          pTVar60 = local_108;
        }
        else {
          in_stack_fffffffffffffe58 = local_108;
          pTVar60 = (TCGContext_conflict *)0xffffffffffffffff;
        }
        uVar22 = uVar22 | 0x8d;
        pTVar60 = (TCGContext_conflict *)((ulong)pTVar60 & 0xffffffff);
LAB_00568b8c:
        in_R9 = (TCGContext_conflict *)0x0;
LAB_00568b8f:
        tcg_out_modrm_sib_offset
                  (s,uVar22,r,base,(int)pTVar60,(int)in_R9,(intptr_t)in_stack_fffffffffffffe58);
        break;
      case 0x4f:
        goto switchD_00567b56_caseD_4f;
      case 0x50:
        uVar55 = 0x1000;
switchD_00567b56_caseD_13:
        if (local_70 != 0) {
          bVar17 = (bVar45 & 7) + bVar45 * '\b' | 0xc0;
          if (TVar36 == (int)(char)bVar63) {
            in_R9 = (TCGContext_conflict *)(ulong)(uVar55 | 0x6b);
            tcg_out_opc(s,uVar55 | 0x6b,r,r,0);
            pbVar29 = s->code_ptr;
            s->code_ptr = pbVar29 + 1;
            *pbVar29 = bVar17;
LAB_005682e4:
            pbVar29 = s->code_ptr;
            s->code_ptr = pbVar29 + 1;
            *pbVar29 = bVar63;
          }
          else {
            in_R9 = (TCGContext_conflict *)(ulong)(uVar55 | 0x69);
            tcg_out_opc(s,uVar55 | 0x69,r,r,0);
            pbVar29 = s->code_ptr;
            s->code_ptr = pbVar29 + 1;
            *pbVar29 = bVar17;
            pTVar28 = (TCGCond *)s->code_ptr;
            *pTVar28 = TVar36;
LAB_00568acb:
            pTVar28 = pTVar28 + 1;
LAB_00568acf:
            s->code_ptr = (tcg_insn_unit *)pTVar28;
          }
          break;
        }
        uVar55 = uVar55 | 0x1af;
        uVar33 = uVar55;
        goto LAB_005686a5;
      case 0x55:
switchD_00567b56_caseD_18:
        tcg_gen_code_arm_cold_18();
        break;
      case 0x56:
switchD_00567b56_caseD_19:
        tcg_gen_code_arm_cold_17();
        break;
      case 0x57:
        iVar21 = 4;
        goto switchD_00567b56_caseD_4f;
      case 0x58:
        iVar21 = 1;
        goto switchD_00567b56_caseD_4f;
      case 0x59:
        iVar21 = 6;
switchD_00567b56_caseD_4f:
        iVar47 = iVar21;
        uVar22 = 0x1000;
switchD_00567b56_caseD_12:
        uVar22 = uVar22 + iVar47;
        in_R9 = (TCGContext_conflict *)(ulong)uVar22;
        if (local_70 == 0) {
          uVar55 = (uVar22 & 0xfffffff8) + (uVar22 & 7) * 8 + 3;
          uVar33 = uVar22 & 7;
LAB_005686a5:
          in_R9 = (TCGContext_conflict *)(ulong)uVar33;
          tcg_out_opc(s,uVar55,r,TVar36,0);
LAB_005681d2:
          bVar17 = ((byte)TVar36 & 7) + bVar45 * '\b';
LAB_005681da:
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = bVar17 | 0xc0;
        }
        else {
          iVar21 = 0;
          pTVar60 = local_108;
LAB_00568a4b:
          tgen_arithi(s,uVar22,r,(tcg_target_long)pTVar60,iVar21);
        }
        break;
      case 0x5a:
        uVar58 = 0x1000;
switchD_00567b56_caseD_1d:
        uVar22 = uVar58;
        pTVar49 = (TCGContext_conflict *)0x4;
        iVar65 = 0x6f7;
        if ((local_118 == local_110 || local_70 == 0) ||
           (&DAT_00000002 < (undefined1 *)((long)local_108[-1].regs + 0x7f)))
        goto switchD_00567b56_caseD_1e;
        uVar22 = uVar22 | 0x8d;
        pTVar60 = local_110;
        if (local_108 == (TCGContext_conflict *)&DAT_00000001) {
          in_stack_fffffffffffffe58 = (TCGContext_conflict *)0x0;
          goto LAB_00568b8c;
        }
        in_stack_fffffffffffffe58 = (TCGContext_conflict *)0x0;
        base = ~TCG_COND_NEVER;
        in_R9 = (TCGContext_conflict *)((ulong)local_108 & 0xffffffff);
        goto LAB_00568b8f;
      case 0x5b:
        uVar22 = 0x1000;
        goto switchD_00567b56_caseD_1e;
      case 0x5c:
        uVar22 = 0x1000;
LAB_00568625:
        pTVar49 = (TCGContext_conflict *)0x7;
        iVar65 = 0x202f7;
switchD_00567b56_caseD_1e:
        if (have_bmi2 == true) {
          if (local_70 != 0) {
            tcg_out_mov(s,(uint)(uVar22 != 0),r,base);
            goto LAB_00568715;
          }
          uVar22 = uVar22 + iVar65;
          in_R9 = (TCGContext_conflict *)(ulong)uVar22;
          goto LAB_005681cd;
        }
LAB_00568715:
        if (uVar51 != 0) {
          uVar22 = (int)pTVar49 + uVar22;
          in_R9 = (TCGContext_conflict *)(ulong)uVar22;
          goto LAB_00568729;
        }
        in_R9 = pTVar49;
        tcg_out_opc(s,uVar22 + 0xd3,(int)pTVar49,r,0);
        bVar17 = (bVar45 & 7) + (char)pTVar49 * '\b';
        goto LAB_005681da;
      case 0x5d:
        goto switchD_00567b56_caseD_5d;
      case 0x5e:
        in_R9 = (TCGContext_conflict *)&DAT_00000001;
switchD_00567b56_caseD_5d:
        pTVar49 = in_R9;
        uVar22 = 0x1000;
        goto LAB_00568715;
      case 0x60:
        if ((undefined1 *)((long)&local_108->pool_cur + CONCAT44(uStack_fc,_local_100)) !=
            (undefined1 *)0x20) goto switchD_00567b56_caseD_23;
        tcg_out_mov(s,TCG_TYPE_I32,r,base);
        uVar22 = 5;
        goto LAB_00568729;
      case 0x62:
        iVar21 = 0x11ac;
LAB_00568846:
        tcg_out_opc(s,iVar21,TVar36,r,0);
        pbVar29 = s->code_ptr;
        s->code_ptr = pbVar29 + 1;
        *pbVar29 = (bVar45 & 7) + bVar63 * '\b' | 0xc0;
        tVar16 = local_100;
LAB_00568881:
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = tVar16;
        break;
      case 99:
      case 0x6a:
        tcg_out_ext32s(s,r,base);
        break;
      case 100:
      case 0x65:
      case 0x6d:
        tcg_gen_code_arm_cold_5();
        break;
      case 0x66:
        uVar22 = 0x1005;
        TVar36 = 0x20;
LAB_00568729:
        tcg_out_shifti(s,uVar22,r,TVar36);
        break;
      case 0x67:
        in_R9 = (TCGContext_conflict *)CONCAT44(uStack_fc,_local_100);
        tcg_out_brcond64(s,TVar36,(TCGArg)local_118,(TCGArg)local_110,local_74,(TCGLabel *)in_R9,
                         (int)in_stack_fffffffffffffe58);
        break;
      case 0x68:
        in_R9 = (TCGContext_conflict *)0x1000;
switchD_00567b56_caseD_2f:
        tcg_out_ext8s(s,r,base,(int)in_R9);
        break;
      case 0x69:
        in_R9 = (TCGContext_conflict *)0x1000;
switchD_00567b56_caseD_30:
        tcg_out_ext16s(s,r,base,(int)in_R9);
        break;
      case 0x70:
        tcg_gen_code_arm_cold_10();
        break;
      case 0x71:
switchD_00567b56_caseD_35:
        tcg_gen_code_arm_cold_13();
        break;
      case 0x72:
switchD_00567b56_caseD_36:
        tcg_gen_code_arm_cold_14();
        break;
      case 0x73:
        uVar33 = 0x1000;
        in_R9 = (TCGContext_conflict *)&DAT_00000001;
LAB_005687cc:
        if (local_70 == 0) {
          tcg_out_vex_opc(s,uVar33 | 0x2f2,r,TVar36,base,(TCGType_conflict)in_R9);
          pbVar29 = s->code_ptr;
          s->code_ptr = pbVar29 + 1;
          *pbVar29 = (bVar17 & 7) + bVar45 * '\b' | 0xc0;
        }
        else {
          tcg_out_mov(s,(TCGType_conflict)in_R9,r,base);
          tgen_arithi(s,uVar33 | 4,r,~(ulong)pTVar52,0);
        }
        break;
      case 0x78:
        iVar21 = 0x1000;
LAB_005685e6:
        in_R9 = (TCGContext_conflict *)(ulong)(local_70 != 0);
        tcg_out_clz(s,iVar21,r,base,(TCGArg)local_108,local_70 != 0);
        break;
      case 0x79:
        iVar21 = 0x1000;
LAB_00568778:
        in_R9 = (TCGContext_conflict *)(ulong)(local_70 != 0);
        tcg_out_ctz(s,iVar21,r,base,(TCGArg)local_108,local_70 != 0);
        break;
      case 0x7a:
LAB_00568ce2:
        tcg_gen_code_arm_cold_16();
        break;
      case 0x7b:
        in_R9 = (TCGContext_conflict *)0x1000;
switchD_00567b56_caseD_27:
        uVar22 = (uint)in_R9;
        if (local_68 == 0) {
          tgen_arithr(s,uVar22,r,local_f8);
        }
        else {
          tgen_arithi(s,uVar22,r,CONCAT44(uStack_f4,local_f8),1);
        }
        uVar22 = uVar22 | 2;
joined_r0x00568a38:
        TVar36 = local_f0;
        r = base;
        if (local_64 != 0) {
          iVar21 = 1;
          pTVar60 = (TCGContext_conflict *)CONCAT44(uStack_ec,local_f0);
          goto LAB_00568a4b;
        }
        goto LAB_00568a8b;
      case 0x7c:
        in_R9 = (TCGContext_conflict *)0x1000;
switchD_00567b56_caseD_28:
        uVar22 = (uint)in_R9;
        uVar33 = uVar22 | 5;
        if (local_68 == 0) {
          tgen_arithr(s,uVar33,r,local_f8);
        }
        else {
          tgen_arithi(s,uVar33,r,CONCAT44(uStack_f4,local_f8),1);
        }
        uVar22 = uVar22 | 3;
        goto joined_r0x00568a38;
      case 0x7d:
switchD_00567b56_caseD_29:
        tcg_gen_code_arm_cold_12();
        break;
      case 0x7e:
switchD_00567b56_caseD_2a:
        tcg_gen_code_arm_cold_11();
        break;
      case 0x82:
        tcg_gen_code_arm_cold_7();
        break;
      case 0x83:
        if (s->tb_jmp_insn_offset == (uintptr_t *)0x0) {
          tcg_out_modrm_offset(s,0xff,4,-1,(intptr_t)(s->tb_jmp_target_addr + (long)local_118));
        }
        else {
          tcg_gen_code_arm_cold_3();
        }
        set_jmp_reset_offset(s,r);
        break;
      case 0x84:
        tcg_gen_code_arm_cold_6();
        break;
      case 0x85:
        _Var18 = false;
        goto LAB_005688c8;
      case 0x86:
        _Var18 = false;
        goto LAB_00568920;
      case 0x87:
        _Var18 = true;
LAB_005688c8:
        tcg_out_qemu_ld(s,(TCGArg *)&stack0xfffffffffffffee8,_Var18);
        break;
      case 0x88:
        _Var18 = true;
LAB_00568920:
        tcg_out_qemu_st(s,(TCGArg *)&stack0xfffffffffffffee8,_Var18);
      }
LAB_005681f0:
      unaff_R12 = unaff_R12 & 0xffffffff;
      if (uVar43 != 0) {
        uVar24 = 0;
        do {
          uVar33 = 4 << ((byte)uVar24 & 0x1f) & uVar64;
          if ((uVar64 >> ((uint)uVar24 & 0x1f) & 1) == 0) {
            if (uVar33 != 0) {
              temp_free_or_dead(s,(TCGTemp *)pTVar38->args[uVar24],1);
            }
          }
          else {
            temp_sync(s,(TCGTemp *)pTVar38->args[uVar24],TVar34,0,uVar33);
          }
          uVar24 = uVar24 + 1;
        } while (uVar43 != uVar24);
      }
LAB_005674d7:
      if (s->code_gen_highwater < s->code_ptr) {
        unaff_R12 = 0xffffffff;
        bVar75 = false;
      }
      else {
        bVar75 = (ulong)((long)s->code_ptr - (long)s->code_buf) < 0x10000;
        unaff_R12 = unaff_R12 & 0xffffffff;
        if (!bVar75) {
          unaff_R12 = 0xfffffffe;
        }
      }
      if (!bVar75) {
        return (int)unaff_R12;
      }
      pTVar38 = (pTVar38->link).tqe_next;
    } while (pTVar38 != (TCGOp *)0x0);
  }
  s->gen_insn_end_off[local_15c] =
       (short)*(undefined4 *)&s->code_ptr - (short)*(undefined4 *)&s->code_buf;
  pTVar67 = (s->ldst_labels).sqh_first;
  if (pTVar67 == (TCGLabelQemuLdst *)0x0) {
    bVar75 = false;
    iVar21 = 0;
  }
  else {
    do {
      uVar64 = pTVar67->oi;
      uVar33 = uVar64 >> 4;
      if (pTVar67->is_ld != true) {
        *(int *)pTVar67->label_ptr[0] = (*(int *)&s->code_ptr - (int)pTVar67->label_ptr[0]) + -4;
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 'H';
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 0x8b;
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 0xfd;
        tcg_out_mov(s,(uint)((~uVar64 & 0x30) == 0),TCG_REG_EDX,pTVar67->datalo_reg);
        tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_ECX,(ulong)uVar64);
        tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_R8,(tcg_target_long)pTVar67->raddr);
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 'A';
        ptVar8 = s->code_ptr;
        s->code_ptr = ptVar8 + 1;
        *ptVar8 = 'P';
        pptVar72 = (tcg_insn_unit **)(qemu_st_helpers + (uVar33 & 0xb));
        goto LAB_00569003;
      }
      uVar51 = (uint)(pTVar67->type == TCG_TYPE_I64) << 0xc;
      *(int *)pTVar67->label_ptr[0] = (*(int *)&s->code_ptr - (int)pTVar67->label_ptr[0]) + -4;
      ptVar8 = s->code_ptr;
      s->code_ptr = ptVar8 + 1;
      *ptVar8 = 'H';
      ptVar8 = s->code_ptr;
      s->code_ptr = ptVar8 + 1;
      *ptVar8 = 0x8b;
      ptVar8 = s->code_ptr;
      s->code_ptr = ptVar8 + 1;
      *ptVar8 = 0xfd;
      tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_EDX,(ulong)uVar64);
      pptVar72 = &pTVar67->raddr;
      tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_ECX,(tcg_target_long)pTVar67->raddr);
      tcg_out_branch(s,1,(tcg_insn_unit *)qemu_ld_helpers[uVar33 & 0xb]);
      TVar20 = pTVar67->datalo_reg;
      switch(uVar33 & 7) {
      default:
        TVar54 = TCG_TYPE_I32;
        break;
      case 3:
        TVar54 = TCG_TYPE_I64;
        break;
      case 4:
        uVar51 = uVar51 | 0x41be;
        goto LAB_00568fd4;
      case 5:
        uVar51 = uVar51 | 0x1bf;
LAB_00568fd4:
        tcg_out_opc(s,uVar51,TVar20,0,0);
        pbVar29 = s->code_ptr;
        s->code_ptr = pbVar29 + 1;
LAB_00569000:
        *pbVar29 = (byte)TVar20 << 3 | 0xc0;
        goto LAB_00569003;
      case 6:
        pbVar29 = *pptVar3;
        *pptVar3 = pbVar29 + 1;
        *pbVar29 = (byte)TVar20 >> 1 & 4 | 0x48;
        ptVar8 = *pptVar3;
        *pptVar3 = ptVar8 + 1;
        *ptVar8 = 'c';
        pbVar29 = *pptVar3;
        *pptVar3 = pbVar29 + 1;
        goto LAB_00569000;
      case 7:
switchD_00568e8f_caseD_7:
        tcg_gen_code_arm_cold_22();
LAB_0056910b:
        __assert_fail("s->gen_insn_end_off[num_insns] == off",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                      ,0xedf,"int tcg_gen_code_arm(TCGContext *, TranslationBlock *)");
      }
      tcg_out_mov(s,TVar54,TVar20,TCG_REG_EAX);
LAB_00569003:
      tcg_out_branch(s,0,*pptVar72);
      bVar75 = s->code_gen_highwater < s->code_ptr;
      if (s->code_gen_highwater < s->code_ptr) {
        iVar21 = -1;
        goto LAB_00569044;
      }
      pTVar67 = (pTVar67->next).sqe_next;
    } while (pTVar67 != (TCGLabelQemuLdst *)0x0);
    iVar21 = 0;
  }
LAB_00569044:
  if ((!bVar75) && (iVar21 = tcg_out_pool_finalize(s), -1 < iVar21)) {
    for (pTVar73 = (s->labels).sqh_first; pTVar73 != (TCGLabel *)0x0;
        pTVar73 = (pTVar73->next).sqe_next) {
      value = (pTVar73->u).value;
      pTVar74 = (TCGRelocation *)&pTVar73->relocs;
      while (pTVar74 = (pTVar74->next).sqe_next, pTVar74 != (TCGRelocation *)0x0) {
        _Var18 = patch_reloc(pTVar74->ptr,pTVar74->type,value,pTVar74->addend);
        if (!_Var18) goto LAB_00569094;
      }
    }
LAB_00569094:
    iVar21 = -2;
    if (pTVar73 == (TCGLabel *)0x0) {
      iVar21 = *(int *)pptVar3 - *(int *)&s->code_buf;
    }
  }
  return iVar21;
}

Assistant:

int tcg_gen_code(TCGContext *s, TranslationBlock *tb)
{
    int i, num_insns;
    TCGOp *op;

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before optimization:");
    }
#endif

#ifdef CONFIG_DEBUG_TCG
    /* Ensure all labels referenced have been emitted.  */
    {
        TCGLabel *l;
        bool error = false;

        QSIMPLEQ_FOREACH(l, &s->labels, next) {
            if (unlikely(!l->present) && l->refs) {
                error = true;
            }
        }
        assert(!error);
    }
#endif

#ifdef USE_TCG_OPTIMIZATIONS
    tcg_optimize(s);
#endif
    //tcg_dump_ops(s, false, "after opt1:");
    reachable_code_pass(s);
    //tcg_dump_ops(s, false, "after opt2:");
    liveness_pass_1(s);
    //tcg_dump_ops(s, false, "after opt3:");
    if (s->nb_indirects > 0) {
        /* Replace indirect temps with direct temps.  */
        if (liveness_pass_2(s)) {
            /* If changes were made, re-run liveness.  */
            liveness_pass_1(s);
        }
    }
    //tcg_dump_ops(s, false, "after opt4:");
    tcg_reg_alloc_start(s);

    s->code_buf = tb->tc.ptr;
    s->code_ptr = tb->tc.ptr;

#ifdef TCG_TARGET_NEED_LDST_LABELS
    QSIMPLEQ_INIT(&s->ldst_labels);
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    s->pool_labels = NULL;
#endif

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before codegen:");
    }
#endif
    num_insns = -1;
    QTAILQ_FOREACH(op, &s->ops, link) {
        TCGOpcode opc = op->opc;

        switch (opc) {
        case INDEX_op_mov_i32:
        case INDEX_op_mov_i64:
        case INDEX_op_mov_vec:
            tcg_reg_alloc_mov(s, op);
            break;
        case INDEX_op_movi_i32:
        case INDEX_op_movi_i64:
        case INDEX_op_dupi_vec:
            tcg_reg_alloc_movi(s, op);
            break;
        case INDEX_op_dup_vec:
            tcg_reg_alloc_dup(s, op);
            break;
        case INDEX_op_insn_start:
            if (num_insns >= 0) {
                size_t off = tcg_current_code_size(s);
                s->gen_insn_end_off[num_insns] = off;
                /* Assert that we do not overflow our stored offset.  */
                assert(s->gen_insn_end_off[num_insns] == off);
            }
            num_insns++;
            for (i = 0; i < TARGET_INSN_START_WORDS; ++i) {
                target_ulong a;
#if TARGET_LONG_BITS > TCG_TARGET_REG_BITS
                a = deposit64(op->args[i * 2], 32, 32, op->args[i * 2 + 1]);
#else
                a = op->args[i];
#endif
                s->gen_insn_data[num_insns][i] = a;
            }
            break;
        case INDEX_op_discard:
            temp_dead(s, arg_temp(op->args[0]));
            break;
        case INDEX_op_set_label:
            tcg_reg_alloc_bb_end(s, s->reserved_regs);
            tcg_out_label(s, arg_label(op->args[0]), s->code_ptr);
            break;
        case INDEX_op_call:
            tcg_reg_alloc_call(s, op);
            break;
        default:
            /* Sanity check that we've not introduced any unhandled opcodes. */
            tcg_debug_assert(tcg_op_supported(opc));
            /* Note: in order to speed up the code, it would be much
               faster to have specialized register allocator functions for
               some common argument patterns */
            tcg_reg_alloc_op(s, op);
            break;
        }
#ifdef CONFIG_DEBUG_TCG
        check_regs(s);
#endif

        /* Test for (pending) buffer overflow.  The assumption is that any
           one operation beginning below the high water mark cannot overrun
           the buffer completely.  Thus we can test for overflow after
           generating code without having to check during generation.  */
        if (unlikely((void *)s->code_ptr > s->code_gen_highwater)) {
            return -1;
        }
        /* Test for TB overflow, as seen by gen_insn_end_off.  */
        if (unlikely(tcg_current_code_size(s) > UINT16_MAX)) {
            return -2;
        }
    }
    tcg_debug_assert(num_insns >= 0);
    s->gen_insn_end_off[num_insns] = tcg_current_code_size(s);

    /* Generate TB finalization at the end of block */
#ifdef TCG_TARGET_NEED_LDST_LABELS
    i = tcg_out_ldst_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    i = tcg_out_pool_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
    if (!tcg_resolve_relocs(s)) {
        return -2;
    }

    /* flush instruction cache */
    flush_icache_range((uintptr_t)s->code_buf, (uintptr_t)s->code_ptr);

    return tcg_current_code_size(s);
}